

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushButtonRepeat(bool repeat)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  bool *pbVar4;
  ImGuiContext *pIVar5;
  bool *__dest;
  int iVar6;
  int iVar7;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->Accessed = true;
  (pIVar3->DC).ButtonRepeat = repeat;
  iVar7 = (pIVar3->DC).ButtonRepeatStack.Size;
  iVar2 = (pIVar3->DC).ButtonRepeatStack.Capacity;
  if (iVar7 == iVar2) {
    iVar7 = iVar7 + 1;
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      piVar1 = &(pIVar5->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      __dest = (bool *)(*(pIVar5->IO).MemAllocFn)((long)iVar7);
      pbVar4 = (pIVar3->DC).ButtonRepeatStack.Data;
      if (pbVar4 != (bool *)0x0) {
        memcpy(__dest,pbVar4,(long)(pIVar3->DC).ButtonRepeatStack.Size);
      }
      pbVar4 = (pIVar3->DC).ButtonRepeatStack.Data;
      if (pbVar4 != (bool *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pbVar4);
      (pIVar3->DC).ButtonRepeatStack.Data = __dest;
      (pIVar3->DC).ButtonRepeatStack.Capacity = iVar7;
    }
  }
  pbVar4 = (pIVar3->DC).ButtonRepeatStack.Data;
  iVar7 = (pIVar3->DC).ButtonRepeatStack.Size;
  (pIVar3->DC).ButtonRepeatStack.Size = iVar7 + 1;
  pbVar4[iVar7] = repeat;
  return;
}

Assistant:

void ImGui::PushButtonRepeat(bool repeat)
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.ButtonRepeat = repeat;
    window->DC.ButtonRepeatStack.push_back(repeat);
}